

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O3

void opj_mqc_encode(opj_mqc_t *mqc,OPJ_UINT32 d)

{
  uint uVar1;
  OPJ_UINT32 OVar2;
  opj_mqc_state_t *poVar3;
  opj_mqc_state *poVar4;
  uint uVar5;
  
  poVar3 = *mqc->curctx;
  uVar1 = poVar3->qeval;
  uVar5 = mqc->a - uVar1;
  OVar2 = poVar3->mps;
  mqc->a = uVar5;
  if (OVar2 == d) {
    if ((short)uVar5 < 0) {
      mqc->c = mqc->c + uVar1;
      return;
    }
    if (uVar5 < uVar1) {
      mqc->a = uVar1;
    }
    else {
      mqc->c = mqc->c + uVar1;
    }
    poVar4 = poVar3->nmps;
  }
  else {
    if (uVar5 < uVar1) {
      mqc->c = mqc->c + uVar1;
    }
    else {
      mqc->a = uVar1;
    }
    poVar4 = poVar3->nlps;
  }
  *mqc->curctx = poVar4;
  opj_mqc_renorme(mqc);
  return;
}

Assistant:

void opj_mqc_encode(opj_mqc_t *mqc, OPJ_UINT32 d)
{
    if ((*mqc->curctx)->mps == d) {
        opj_mqc_codemps(mqc);
    } else {
        opj_mqc_codelps(mqc);
    }
}